

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateFastBrOrCmEqDefinite
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool *pNeedHelper,bool isBranch,
          bool isInHelper)

{
  Lowerer *this_00;
  Opnd *pOVar1;
  code *pcVar2;
  undefined4 uVar3;
  bool bVar4;
  bool bVar5;
  OpndKind OVar6;
  uint32 offset;
  LabelInstr *target;
  Lowerer *this_01;
  Lowerer *this_02;
  undefined4 *puVar7;
  BranchInstr *pBVar8;
  Opnd *pOVar9;
  RegOpnd *pRVar10;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar11;
  IntConstOpnd *src2;
  Instr *insertBeforeInstr;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar12;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  LabelInstr *branchTarget;
  Lowerer *pLVar13;
  Lowerer *compareSrc2;
  LabelInstr *instr_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_84;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_82;
  LabelInstr *local_80;
  undefined4 local_78;
  LibraryValue local_74;
  LabelInstr *local_70;
  Lowerer *local_68;
  LabelInstr *local_60;
  LibraryValue local_54;
  Lowerer *local_50;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  Instr *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  local_40 = (Instr *)CONCAT44(local_40._4_4_,(int)CONCAT71(in_register_00000089,isInHelper));
  local_78 = (undefined4)CONCAT71(in_register_00000081,isBranch);
  this_00 = (Lowerer *)instr->m_src1;
  pLVar13 = (Lowerer *)instr->m_src2;
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(this_00->m_lowererMD).FloatPrefThreshold
  ;
  bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
  if (!bVar4) {
    local_42 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(pLVar13->m_lowererMD).FloatPrefThreshold;
    bVar4 = ValueType::IsDefinite((ValueType *)&local_42.field_0);
    if (!bVar4) {
      return false;
    }
  }
  local_50 = pLVar13;
  bVar4 = IR::Opnd::IsEqual((Opnd *)this_00,(Opnd *)pLVar13);
  if (bVar4) {
    return false;
  }
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(this_00->m_lowererMD).FloatPrefThreshold
  ;
  local_68 = this;
  bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
  if (bVar4) {
    local_42 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(local_50->m_lowererMD).FloatPrefThreshold;
    bVar4 = ValueType::IsDefinite((ValueType *)&local_42.field_0);
    if (bVar4) {
      bVar4 = IR::Opnd::IsTaggedValue((Opnd *)this_00);
      if (bVar4) {
        return true;
      }
      bVar4 = IR::Opnd::IsTaggedValue((Opnd *)local_50);
      if (bVar4) {
        return true;
      }
    }
  }
  target = IR::Instr::GetOrCreateContinueLabel(instr,false);
  uVar3 = local_78;
  local_80 = IR::LabelInstr::New(Label,local_68->m_func,local_40._0_1_);
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(this_00->m_lowererMD).FloatPrefThreshold
  ;
  bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
  pLVar13 = local_50;
  this_01 = local_50;
  if (bVar4) {
    this_01 = this_00;
  }
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(this_00->m_lowererMD).FloatPrefThreshold
  ;
  bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
  this_02 = this_00;
  if (bVar4) {
    this_02 = pLVar13;
  }
  local_40 = instr;
  bVar4 = IR::Instr::IsNeq(instr);
  insertBeforeInstr = local_40;
  pLVar13 = local_68;
  if ((char)uVar3 == '\0') {
    local_70 = IR::LabelInstr::New(Label,local_68->m_func,false);
    local_60 = IR::LabelInstr::New(Label,pLVar13->m_func,false);
    local_74 = ValueFalse - bVar4;
    local_54 = bVar4 + ValueTrue;
    insertBeforeInstr = local_40;
    compareSrc2 = local_50;
  }
  else {
    local_70 = target;
    if (!bVar4) {
      if (local_40->m_kind != InstrKindBranch) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
        if (!bVar5) goto LAB_005dc350;
        *puVar7 = 0;
      }
      local_70 = (LabelInstr *)insertBeforeInstr[1].m_next;
    }
    compareSrc2 = local_50;
    local_74 = ValueInvalid;
    if (bVar4) {
      if (insertBeforeInstr->m_kind != InstrKindBranch) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
        if (!bVar4) goto LAB_005dc350;
        *puVar7 = 0;
      }
      local_54 = ValueInvalid;
      pLVar13 = local_68;
      local_60 = (LabelInstr *)insertBeforeInstr[1].m_next;
    }
    else {
      local_54 = ValueInvalid;
      pLVar13 = local_68;
      local_60 = target;
    }
  }
  OVar6 = IR::Opnd::GetKind((Opnd *)this_02);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5d93,"(likelySrc->IsRegOpnd())","likelySrc->IsRegOpnd()");
    if (!bVar4) {
LAB_005dc350:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    pLVar13 = local_68;
  }
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(this_01->m_lowererMD).FloatPrefThreshold
  ;
  paVar12 = &local_32;
  bVar4 = ValueType::IsAnyArray((ValueType *)&paVar12->field_0);
  if (!bVar4) {
    local_42 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(this_01->m_lowererMD).FloatPrefThreshold;
    paVar12 = &local_42;
    bVar4 = ValueType::IsSymbol((ValueType *)&paVar12->field_0);
    if (!bVar4) {
      local_84 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  &(this_01->m_lowererMD).FloatPrefThreshold;
      paVar12 = &local_84;
      bVar4 = ValueType::IsBoolean((ValueType *)&paVar12->field_0);
      if (!bVar4) {
        local_82 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                    &(this_01->m_lowererMD).FloatPrefThreshold;
        paVar12 = &local_82;
        bVar4 = ValueType::IsPrimitiveOrObject((ValueType *)&paVar12->field_0);
        if (!bVar4) {
          local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                      &(this_01->m_lowererMD).FloatPrefThreshold;
          paVar12 = &local_32;
          bVar4 = ValueType::IsObject((ValueType *)&paVar12->field_0);
          instr_00 = local_70;
          if ((bVar4) && ((DAT_015b021f & 1) == 0)) {
            InsertCompareBranch((Lowerer *)&paVar12->field_0,(Opnd *)this_00,(Opnd *)compareSrc2,
                                BrEq_A,false,local_70,insertBeforeInstr,false);
            local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                        &(this_02->m_lowererMD).FloatPrefThreshold;
            bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
            if (bVar4) {
              *pNeedHelper = false;
              branchTarget = local_60;
            }
            else {
              pRVar10 = IR::Opnd::AsRegOpnd((Opnd *)this_02);
              branchTarget = local_60;
              LowererMD::GenerateObjectTest
                        (&pLVar13->m_lowererMD,&pRVar10->super_Opnd,local_40,local_60,false);
              pRVar10 = IR::RegOpnd::New(TyInt64,pLVar13->m_func);
              baseOpnd = IR::Opnd::AsRegOpnd((Opnd *)this_02);
              pIVar11 = IR::IndirOpnd::New(baseOpnd,8,TyInt64,pLVar13->m_func,false);
              InsertMove(&pRVar10->super_Opnd,&pIVar11->super_Opnd,local_40,true);
              offset = Js::Type::GetOffsetOfFlags();
              pIVar11 = IR::IndirOpnd::New(pRVar10,offset,TyInt8,pLVar13->m_func,false);
              src2 = IR::IntConstOpnd::New(8,TyInt8,pLVar13->m_func,false);
              insertBeforeInstr = local_40;
              InsertTest(&pIVar11->super_Opnd,&src2->super_Opnd,local_40);
              InsertBranch(BrNeq_A,false,local_80,insertBeforeInstr);
            }
            pBVar8 = IR::BranchInstr::New(JMP,branchTarget,pLVar13->m_func);
            IR::Instr::InsertBefore(insertBeforeInstr,&pBVar8->super_Instr);
          }
          else {
            bVar4 = IR::Opnd::IsTaggedInt((Opnd *)this_01);
            instr_00 = local_70;
            if (!bVar4) {
              return true;
            }
            InsertCompareBranch(this_01,(Opnd *)this_00,(Opnd *)local_50,BrEq_A,false,local_70,
                                insertBeforeInstr,false);
            pLVar13 = local_68;
            pBVar8 = IR::BranchInstr::New(JMP,local_80,local_68->m_func);
            IR::Instr::InsertBefore(insertBeforeInstr,&pBVar8->super_Instr);
            branchTarget = local_60;
          }
          goto LAB_005dc0bf;
        }
      }
    }
  }
  instr_00 = local_70;
  InsertCompareBranch((Lowerer *)&paVar12->field_0,(Opnd *)this_00,(Opnd *)compareSrc2,BrEq_A,false,
                      local_70,insertBeforeInstr,false);
  branchTarget = local_60;
  pBVar8 = IR::BranchInstr::New(JMP,local_60,pLVar13->m_func);
  IR::Instr::InsertBefore(insertBeforeInstr,&pBVar8->super_Instr);
  *pNeedHelper = false;
LAB_005dc0bf:
  if ((char)local_78 == '\0') {
    IR::Instr::InsertBefore(insertBeforeInstr,&instr_00->super_Instr);
    pOVar1 = local_40->m_dst;
    pOVar9 = LoadLibraryValueOpnd(pLVar13,local_40,local_54);
    InsertMove(pOVar1,pOVar9,local_40,true);
    InsertBranch(Br,false,target,local_40);
    IR::Instr::InsertBefore(local_40,&branchTarget->super_Instr);
    pOVar1 = local_40->m_dst;
    pOVar9 = LoadLibraryValueOpnd(pLVar13,local_40,local_74);
    insertBeforeInstr = local_40;
    InsertMove(pOVar1,pOVar9,local_40,true);
    InsertBranch(Br,false,target,insertBeforeInstr);
  }
  IR::Instr::InsertBefore(insertBeforeInstr,&local_80->super_Instr);
  return true;
}

Assistant:

bool Lowerer::GenerateFastBrOrCmEqDefinite(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool *pNeedHelper, bool isBranch, bool isInHelper)
{
    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *src2 = instr->GetSrc2();

    if (!src1->GetValueType().IsDefinite() && !src2->GetValueType().IsDefinite())
    {
        return false;
    }
    if (src1->IsEqual(src2))
    {
        return false;
    }
    if (src1->GetValueType().IsDefinite() && src2->GetValueType().IsDefinite())
    {
        if (src1->IsTaggedValue() || src2->IsTaggedValue())
        {
            return true;
        }
    }

    IR::LabelInstr * labelBranchSuccess = nullptr;
    IR::LabelInstr * labelBranchFailure = nullptr;
    IR::LabelInstr * labelFallThrough = instr->GetOrCreateContinueLabel();
    IR::LabelInstr * labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);

    LibraryValue successValueType = ValueInvalid;
    LibraryValue failureValueType = ValueInvalid;

    IR::Opnd * definiteSrc = src1->GetValueType().IsDefinite() ? src1 : src2;
    IR::Opnd * likelySrc = src1->GetValueType().IsDefinite() ? src2 : src1;

    bool isEqual = !instr->IsNeq();

    if (!isBranch)
    {
        labelBranchSuccess = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, false);
        labelBranchFailure = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, false);
        successValueType = isEqual ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
        failureValueType = isEqual ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;
    }
    else
    {
        labelBranchSuccess = isEqual ? instr->AsBranchInstr()->GetTarget() : labelFallThrough;
        labelBranchFailure = isEqual ? labelFallThrough : instr->AsBranchInstr()->GetTarget();
    }

    Assert(likelySrc->IsRegOpnd());

    if (definiteSrc->GetValueType().IsAnyArray() || definiteSrc->GetValueType().IsSymbol() || definiteSrc->GetValueType().IsBoolean() || definiteSrc->GetValueType().IsPrimitiveOrObject())
    {
        InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);
        IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchFailure, this->m_func);
        instr->InsertBefore(branch);
        *pNeedHelper = false;
    }
    else if (definiteSrc->GetValueType().IsObject() && !CONFIG_FLAG(ESBigInt))
    {
        InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);

        if (!likelySrc->GetValueType().IsDefinite())
        {
            m_lowererMD.GenerateObjectTest(likelySrc->AsRegOpnd(), instr, labelBranchFailure);
            IR::RegOpnd * likelyTypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            IR::IndirOpnd * likelyType = IR::IndirOpnd::New(likelySrc->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func);
            Lowerer::InsertMove(likelyTypeReg, likelyType, instr);
            IR::Opnd *likelyFlags = IR::IndirOpnd::New(likelyTypeReg, Js::Type::GetOffsetOfFlags(), TyInt8, this->m_func);
            InsertTestBranch(likelyFlags, IR::IntConstOpnd::New(TypeFlagMask_EngineExternal, TyInt8, this->m_func), Js::OpCode::BrNeq_A, labelHelper, instr);
        }
        else
        {
            *pNeedHelper = false;
        }

        IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchFailure, this->m_func);
        instr->InsertBefore(branch);
    }
    else if (definiteSrc->IsTaggedInt())
    {
        InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);
        IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelHelper, this->m_func);
        instr->InsertBefore(branch);
    }
    else
    {
        return true;
    }

    if (!isBranch)
    {
        instr->InsertBefore(labelBranchSuccess);
        InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
        InsertBranch(Js::OpCode::Br, labelFallThrough, instr);

        instr->InsertBefore(labelBranchFailure);
        InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, failureValueType), instr);
        InsertBranch(Js::OpCode::Br, labelFallThrough, instr);
    }

    instr->InsertBefore(labelHelper);

    return true;
}